

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O1

uint32_t predict_bandit_adf(warm_cb *data,multi_learner *base,example *ec)

{
  uint64_t *puVar1;
  int iVar2;
  pointer ppeVar3;
  example *peVar4;
  size_t sVar5;
  action_score *_begin;
  int iVar6;
  pointer ppeVar7;
  vw_exception *this;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  uint32_t chosen_action;
  stringstream __msg;
  uint32_t local_1fc;
  string local_1f8;
  pointer_____offset_0x10___ *local_1d8;
  float *local_1d0;
  vector<float,_std::allocator<float>_> local_1c8;
  pointer_____offset_0x10___ *local_1b0;
  float *local_1a8;
  ostream local_1a0;
  
  std::vector<float,_std::allocator<float>_>::vector(&local_1c8,&data->cumulative_costs);
  uVar9 = 0;
  iVar6 = 0;
  if ((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    fVar10 = 3.4028235e+38;
    uVar8 = 0;
    do {
      if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] < fVar10) {
        uVar9 = uVar8 & 0xffffffff;
        fVar10 = local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
      }
      iVar6 = (int)uVar9;
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) <
             (ulong)((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  copy_example_to_adf(data,ec);
  ppeVar7 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar3 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar7 != ppeVar3) {
    iVar2 = *(int *)(base + 0xe0);
    do {
      puVar1 = &((*ppeVar7)->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(iVar2 * iVar6);
      ppeVar7 = ppeVar7 + 1;
    } while (ppeVar7 != ppeVar3);
  }
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&data->ecs);
  ppeVar7 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar3 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar7 != ppeVar3) {
    iVar2 = *(int *)(base + 0xe0);
    do {
      puVar1 = &((*ppeVar7)->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(iVar6 * iVar2);
      ppeVar7 = ppeVar7 + 1;
    } while (ppeVar7 != ppeVar3);
  }
  peVar4 = *(data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  sVar5 = data->example_counter;
  data->example_counter = sVar5 + 1;
  local_1a8 = (peVar4->pred).scalars._begin;
  local_1d0 = (peVar4->pred).scalars._end;
  local_1b0 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_1d8 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar6 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                    (sVar5 + data->app_seed,&local_1b0,&local_1d8,&local_1fc);
  if (iVar6 == 0) {
    v_array<ACTION_SCORE::action_score>::clear(&data->a_s_adf);
    _begin = (peVar4->pred).a_s._begin;
    push_many<ACTION_SCORE::action_score>
              (&data->a_s_adf,_begin,(long)(peVar4->pred).scalars._end - (long)_begin >> 3);
    return local_1fc;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,"Failed to sample from pdf",0x19);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/warm_cb.cc"
             ,0x19f,&local_1f8);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

uint32_t predict_bandit_adf(warm_cb& data, multi_learner& base, example& ec)
{
	uint32_t argmin = find_min(data.cumulative_costs);

  copy_example_to_adf(data, ec);
	base.predict(data.ecs, argmin);

	auto& out_ec = *data.ecs[0];
  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

	auto& a_s = data.a_s_adf;
	copy_array<action_score>(a_s, out_ec.pred.a_s);

	return chosen_action;
}